

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

bool __thiscall iDynTree::BerdyHelper::initOriginalBerdyFixedBase(BerdyHelper *this)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  SensorType *pSVar4;
  ulong uVar5;
  undefined8 uVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  int local_1fc;
  char *local_1f8 [4];
  string local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  lVar9 = 0;
  while( true ) {
    lVar2 = iDynTree::Model::getNrOfJoints();
    if (lVar2 <= lVar9) {
      local_1fc = 0;
      do {
        if (4 < local_1fc) {
          lVar2 = iDynTree::Model::getNrOfDOFs();
          lVar9 = 0x14;
          if ((this->m_options).includeAllNetExternalWrenchesAsDynamicVariables != false) {
            lVar9 = 0x1a;
          }
          this->m_nrOfDynamicalVariables = lVar9 * lVar2;
          this->m_nrOfDynamicEquations = lVar2 * 0x13;
          initSensorsMeasurements(this);
          return true;
        }
        if (local_1fc - 1U < 4) {
          uVar8 = 0;
          while( true ) {
            pSVar4 = (SensorType *)iDynTree::Model::sensors();
            uVar5 = iDynTree::SensorsList::getNrOfSensors(pSVar4);
            if (uVar5 <= uVar8) break;
            pSVar4 = (SensorType *)iDynTree::Model::sensors();
            uVar6 = iDynTree::SensorsList::getSensor(pSVar4,(long)&local_1fc);
            plVar3 = (long *)__dynamic_cast(uVar6,&Sensor::typeinfo,&LinkSensor::typeinfo,0);
            lVar9 = (**(code **)(*plVar3 + 0x50))(plVar3);
            iDynTree::Traversal::getBaseLink();
            lVar2 = iDynTree::Link::getIndex();
            uVar8 = uVar8 + 1;
            if (lVar9 == lVar2) {
              std::__cxx11::stringstream::stringstream((stringstream *)&ss);
              poVar7 = std::operator<<(local_1a8,"Sensor ");
              (**(code **)(*plVar3 + 0x10))(local_1f8,plVar3);
              poVar7 = std::operator<<(poVar7,(string *)local_1f8);
              poVar7 = std::operator<<(poVar7," is attached to link ");
              iDynTree::Model::getLinkName_abi_cxx11_((long)local_1d8);
              poVar7 = std::operator<<(poVar7,local_1d8);
              std::operator<<(poVar7,
                              " but this link is the base link and base link sensors are not supported by the original berdy."
                             );
              std::__cxx11::string::~string(local_1d8);
              std::__cxx11::string::~string((string *)local_1f8);
              std::__cxx11::stringbuf::str();
              iDynTree::reportError("BerdyHelpers","init",local_1f8[0]);
              goto LAB_001aa630;
            }
          }
        }
        local_1fc = local_1fc + 1;
      } while( true );
    }
    plVar3 = (long *)iDynTree::Model::getJoint((long)this);
    iVar1 = (**(code **)(*plVar3 + 0x20))(plVar3);
    if (iVar1 != 1) break;
    lVar9 = lVar9 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar7 = std::operator<<(local_1a8,"Joint ");
  iDynTree::Model::getJointName_abi_cxx11_((long)local_1f8);
  poVar7 = std::operator<<(poVar7,(string *)local_1f8);
  poVar7 = std::operator<<(poVar7," has ");
  plVar3 = (long *)iDynTree::Model::getJoint((long)this);
  (**(code **)(*plVar3 + 0x20))(plVar3);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,
                  " DOFs , but the original fixed base formulation of berdy only supports 1 dof frames"
                 );
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::stringbuf::str();
  iDynTree::reportError("BerdyHelpers","init",local_1f8[0]);
LAB_001aa630:
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return false;
}

Assistant:

bool BerdyHelper::initOriginalBerdyFixedBase()
{
    // Check that all joints have 1 dof
    for(JointIndex jntIdx = 0; jntIdx < static_cast<JointIndex>(m_model.getNrOfJoints()); jntIdx++)
    {
        if( m_model.getJoint(jntIdx)->getNrOfDOFs() != 1 )
        {
            std::stringstream ss;
            ss << "Joint " << m_model.getJointName(jntIdx) << " has " << m_model.getJoint(jntIdx)->getNrOfDOFs() << " DOFs , but the original fixed base formulation of berdy only supports 1 dof frames";
            reportError("BerdyHelpers","init",ss.str().c_str());
            return false;
        }
    }

    // Check that no sensors are attached to the base (this is not supported by the original berdy)
    for(SensorType type=SIX_AXIS_FORCE_TORQUE; type < NR_OF_SENSOR_TYPES; type = (SensorType)(type+1))
    {
        // TODO : link sensor are extremly widespared and they have all approximatly the same API,
        //        so we need a better way to iterate over them
        if( isLinkSensor(type) )
        {
            for(size_t sensIdx = 0; sensIdx < m_model.sensors().getNrOfSensors(type); sensIdx++)
            {
                LinkSensor * linkSensor = dynamic_cast<LinkSensor*>(m_model.sensors().getSensor(type,sensIdx));

                LinkIndex   linkToWhichTheSensorIsAttached = linkSensor->getParentLinkIndex();

                if( linkToWhichTheSensorIsAttached == m_dynamicsTraversal.getBaseLink()->getIndex() )
                {
                    std::stringstream ss;
                    ss << "Sensor " << linkSensor->getName() << " is attached to link " << m_model.getLinkName(linkToWhichTheSensorIsAttached) << " but this link is the base link and base link sensors are not supported by the original berdy.";
                    reportError("BerdyHelpers","init",ss.str().c_str());
                    return false;
                }
            }
        }
    }


    // N will be the number of joints/links/dofs
    // We assume that the fixed base is fixed, so we include in the model only N links
    size_t nrOfDOFs = m_model.getNrOfDOFs();

    // In the classical Berdy formulation, we have 6*4 + 2*1 dynamical variables
    size_t nrOfDynamicVariablesForDOFs = m_options.includeAllNetExternalWrenchesAsDynamicVariables ? 6*4+2*1 : 6*3+2*1;
    m_nrOfDynamicalVariables = nrOfDynamicVariablesForDOFs*nrOfDOFs;
    // 19 Dynamics equations are considered in the original berdy :
    // 6 for the propagation of 6d acceleration
    // 6 for the computation of the net wrench from acc and vel
    // 6 for the computation of the joint wrench
    // 1 for the torque computations
    m_nrOfDynamicEquations   = (18+1)*nrOfDOFs;

    initSensorsMeasurements();

    return true;
}